

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O0

double __thiscall
opengv::absolute_pose::modules::Epnp::compute_R_and_t
          (Epnp *this,MatrixXd *Ut,double *betas,double (*R) [3],double *t)

{
  MatrixXd *in_RCX;
  double *in_RDX;
  Epnp *in_RSI;
  Epnp *in_RDI;
  double dVar1;
  double *in_stack_00000660;
  double (*in_stack_00000668) [3];
  Epnp *in_stack_00000670;
  
  compute_ccs(in_RSI,in_RDX,in_RCX);
  compute_pcs(in_RDI);
  solve_for_sign(in_RDI);
  estimate_R_and_t(in_stack_00000670,in_stack_00000668,in_stack_00000660);
  dVar1 = reprojection_error(this,(double (*) [3])Ut,betas);
  return dVar1;
}

Assistant:

double
opengv::absolute_pose::modules::Epnp::compute_R_and_t(
    const Eigen::MatrixXd & Ut,
    const double * betas,
    double R[3][3],
    double t[3])
{
  compute_ccs(betas, Ut);
  compute_pcs();

  solve_for_sign();

  estimate_R_and_t(R, t);

  return reprojection_error(R, t);
}